

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O0

bool duckdb::Hugeint::TryConvert<const_char_*>(char *value,hugeint_t *result)

{
  bool bVar1;
  size_t in;
  char *in_RDI;
  bool in_stack_00000017;
  hugeint_t *in_stack_00000018;
  string_t string_val;
  size_t len;
  undefined8 in_stack_ffffffffffffffd0;
  uint32_t len_00;
  char *in_stack_ffffffffffffffd8;
  string_t *in_stack_ffffffffffffffe0;
  
  len_00 = (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  in = strlen(in_RDI);
  UnsafeNumericCast<unsigned_int,_unsigned_long,_void>(in);
  string_t::string_t(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,len_00);
  bVar1 = TryCast::Operation<duckdb::string_t,_duckdb::hugeint_t>
                    (string_val,in_stack_00000018,in_stack_00000017);
  return bVar1;
}

Assistant:

bool Hugeint::TryConvert(const char *value, hugeint_t &result) {
	auto len = strlen(value);
	string_t string_val(value, UnsafeNumericCast<uint32_t>(len));
	return TryCast::Operation<string_t, hugeint_t>(string_val, result, true);
}